

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O2

z_size_t gzfwrite(voidpc buf,z_size_t size,z_size_t nitems,gzFile file)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  z_size_t zVar3;
  
  if (((file != (gzFile)0x0) && (file[1].have == 0x79b1)) &&
     (*(int *)((long)&file[4].next + 4) == 0)) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = size;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = nitems;
    zVar3 = SUB168(auVar1 * auVar2,0);
    if ((size == 0) || (SUB168(auVar1 * auVar2,8) == 0)) {
      if (zVar3 != 0) {
        zVar3 = gz_write((gz_statep)file,buf,zVar3);
        return zVar3 / size;
      }
    }
    else {
      gz_error((gz_statep)file,-2,"request does not fit in a size_t");
    }
    return 0;
  }
  return 0;
}

Assistant:

z_size_t ZEXPORT gzfwrite(buf, size, nitems, file)
    voidpc buf;
    z_size_t size;
    z_size_t nitems;
    gzFile file;
{
    z_size_t len;
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return 0;
    state = (gz_statep)file;

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return 0;

    /* compute bytes to read -- error on overflow */
    len = nitems * size;
    if (size && len / size != nitems) {
        gz_error(state, Z_STREAM_ERROR, "request does not fit in a size_t");
        return 0;
    }

    /* write len bytes to buf, return the number of full items written */
    return len ? gz_write(state, buf, len) / size : 0;
}